

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_init_file(mz_zip_archive *pZip,char *pFilename,mz_uint32 flags)

{
  int iVar1;
  mz_bool mVar2;
  FILE *__stream;
  __off64_t _Var3;
  char *in_RSI;
  __off64_t *in_RDI;
  FILE *pFile;
  mz_uint64 file_size;
  mz_uint32 in_stack_00001034;
  mz_zip_archive *in_stack_00001038;
  mz_zip_archive *in_stack_ffffffffffffffc8;
  mz_bool local_4;
  
  __stream = fopen64(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = fseeko64(__stream,0,2);
    if (iVar1 == 0) {
      _Var3 = ftello64(__stream);
      mVar2 = tinyexr::miniz::mz_zip_reader_init_internal(in_stack_ffffffffffffffc8,0);
      if (mVar2 == 0) {
        fclose(__stream);
        local_4 = 0;
      }
      else {
        in_RDI[8] = (__off64_t)tinyexr::miniz::mz_zip_file_read_func;
        in_RDI[10] = (__off64_t)in_RDI;
        *(FILE **)(in_RDI[0xb] + 0x60) = __stream;
        *in_RDI = _Var3;
        mVar2 = tinyexr::miniz::mz_zip_reader_read_central_dir(in_stack_00001038,in_stack_00001034);
        if (mVar2 == 0) {
          mz_zip_reader_end(in_stack_ffffffffffffffc8);
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      fclose(__stream);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_init_file(mz_zip_archive *pZip, const char *pFilename,
                                mz_uint32 flags) {
  mz_uint64 file_size;
  MZ_FILE *pFile = MZ_FOPEN(pFilename, "rb");
  if (!pFile) return MZ_FALSE;
  if (MZ_FSEEK64(pFile, 0, SEEK_END)) {
    MZ_FCLOSE(pFile);
    return MZ_FALSE;
  }
  file_size = MZ_FTELL64(pFile);
  if (!mz_zip_reader_init_internal(pZip, flags)) {
    MZ_FCLOSE(pFile);
    return MZ_FALSE;
  }
  pZip->m_pRead = mz_zip_file_read_func;
  pZip->m_pIO_opaque = pZip;
  pZip->m_pState->m_pFile = pFile;
  pZip->m_archive_size = file_size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}